

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.c
# Opt level: O0

void env_arr_put(char *identifer,int line,long index,Object value,Environment *env)

{
  Record *pRVar1;
  Record *get;
  Environment *env_local;
  long index_local;
  int line_local;
  char *identifer_local;
  
  pRVar1 = env_match(identifer,env);
  if (pRVar1 == (Record *)0x0) {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Undefined array %s!\x1b[0m",(ulong)(uint)line,
           identifer);
    stop();
  }
  else if ((pRVar1->object).type == OBJECT_ARRAY) {
    if ((index < 1) || ((pRVar1->object).field_1.literal.line < index)) {
      printf("\x1b[31m\n[Runtime Error] [Line:%d] Array index out of range [%ld]!\x1b[0m",
             (ulong)(uint)line,index);
      stop();
    }
  }
  else {
    printf("\x1b[31m\n[Runtime Error] [Line:%d] Variable %s is not an array!\x1b[0m",
           (ulong)(uint)line,identifer);
    stop();
  }
  memcpy((pRVar1->object).field_1.arr.values + index + -1,&value,0x40);
  return;
}

Assistant:

void env_arr_put(char *identifer, int line, long index, Object value, Environment *env){
    Record *get = env_match(identifer, env);
    if(get == NULL){
        printf(runtime_error("Undefined array %s!"), line, identifer);
        stop();
    }
    else if(get->object.type != OBJECT_ARRAY){
        printf(runtime_error("Variable %s is not an array!"), line, identifer);
        stop();
    }
    else if(index < 1 || get->object.arr.count < index){
        printf(runtime_error("Array index out of range [%ld]!"), line, index);
        stop();
    }

    get->object.arr.values[index - 1] = value;
}